

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O0

void Eigen::internal::
     visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_Eigen::internal::visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_21>
     ::run(visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *mat,
          max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *visitor)

{
  CoeffReturnType value;
  max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *visitor_local;
  visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *mat_local;
  
  visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_Eigen::internal::visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_20>
  ::run(mat,visitor);
  value = visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>::coeff(mat,0x14,0);
  max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>::operator()(visitor,value,0x14,0);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
  static inline void run(const Derived &mat, Visitor& visitor)
  {
    visitor_impl<Visitor, Derived, UnrollCount-1>::run(mat, visitor);
    visitor(mat.coeff(row, col), row, col);
  }